

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O1

void __thiscall
defyx::CompiledVm<defyx::LargePageAllocator,_false>::run
          (CompiledVm<defyx::LargePageAllocator,_false> *this,void *seed)

{
  VmBase<defyx::LargePageAllocator,_false>::generateProgram
            ((VmBase<defyx::LargePageAllocator,_false> *)this,seed);
  defyx_vm::initialize((defyx_vm *)this);
  JitCompilerX86::generateProgram
            (&this->compiler,(Program *)&this->field_0x40,(ProgramConfiguration *)&this->field_0x3c0
            );
  *(long *)&this->field_0x3e8 = **(long **)&this->field_0x3f8 + *(long *)&this->field_0x400;
  (*(code *)(this->compiler).code)
            (&this->field_0x2c0,&this->field_0x3e0,*(undefined8 *)&this->field_0x3f0,0x400);
  return;
}

Assistant:

void CompiledVm<Allocator, softAes>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		defyx_vm::initialize();
		compiler.generateProgram(program, config);
		mem.memory = datasetPtr->memory + datasetOffset;
		execute();
	}